

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::SFML::Init(Window *window,RenderTarget *target,bool loadDefaultFont)

{
  bool bVar1;
  uint extraout_var;
  Vector2<unsigned_int> local_2c;
  Vector2<float> local_24;
  byte local_19;
  RenderTarget *pRStack_18;
  bool loadDefaultFont_local;
  RenderTarget *target_local;
  Window *window_local;
  
  local_19 = loadDefaultFont;
  pRStack_18 = target;
  target_local = (RenderTarget *)window;
  local_2c.x = (*target->_vptr_RenderTarget[2])();
  local_2c.y = extraout_var;
  sf::Vector2<float>::Vector2<unsigned_int>(&local_24,&local_2c);
  bVar1 = Init(window,&local_24,(bool)(local_19 & 1));
  return bVar1;
}

Assistant:

bool Init(sf::Window& window, sf::RenderTarget& target, bool loadDefaultFont) {
    return Init(window, static_cast<sf::Vector2f>(target.getSize()), loadDefaultFont);
}